

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  typeOfCode type;
  typeOfCode type_00;
  typeOfCode type_01;
  typeOfCode type_02;
  typeOfCode type_03;
  typeOfCode type_04;
  typeOfCode type_05;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  BMP file;
  ofstream out;
  
  setlocale(6,"RUS");
  BMP::BMP(&file,"D:\\Git\\INF\\src8.bmp");
  std::ofstream::ofstream(&out,"D:\\Git\\INF\\output.txt",_S_out);
  BMP::writeInfo(&file,(ofstream *)0x0);
  BMP::writeMatrix(&file,(ofstream *)0x0);
  BMP::writeFrequency(&file,(ofstream *)0x0);
  std::operator<<((ostream *)&std::cout,"\nEntropy: ");
  lVar3 = in_ST6;
  BMP::getEntropy(&file);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST0);
  std::endl<char,std::char_traits<char>>(poVar1);
  BMP::writeCodesOfMessage(&file,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfMessage(&file,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfMessage(&file,SHANNON,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&file,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&file,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&file,SHANNON,(ofstream *)0x0);
  std::operator<<((ostream *)&std::cout,"Size Uniform Codes: ");
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x0,type);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Size Code Shannon:  ");
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x2,type_00);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Size Code Huffman:  ");
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x1,type_01);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Compression ratio Shannon\'s code: ");
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x0,type_02);
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x2,type_03);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST4 / in_ST5);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Compression ratio Huffman\'s code: ");
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x0,type_04);
  BMP::byteSizeCode((longdouble *)&file,(BMP *)0x1,type_05);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST6 / lVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = BMP::sizeCode(&file,UNIFORM);
  lVar3 = (longdouble)lVar2;
  lVar2 = BMP::sizeCode(&file,SHANNON);
  lVar4 = (longdouble)lVar2;
  lVar2 = BMP::sizeCode(&file,HUFFMAN);
  lVar5 = (longdouble)lVar2;
  poVar1 = std::ostream::_M_insert<long_double>(lVar3);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<long_double>(lVar4);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<long_double>(lVar5);
  std::operator<<(poVar1,'\n');
  std::operator<<((ostream *)&std::cout,"Redundancy Shannon\'s code: ");
  poVar1 = std::ostream::_M_insert<long_double>((lVar3 - lVar4) / lVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Redundancy Huffman\'s code: ");
  poVar1 = std::ostream::_M_insert<long_double>((lVar3 - lVar5) / lVar5);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  BMP::~BMP(&file);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "RUS");
    BMP file( (char *)"D:\\Git\\INF\\src8.bmp" );
    ofstream out("D:\\Git\\INF\\output.txt");
    file.writeInfo();
    file.writeMatrix();
    file.writeFrequency();
    cout << "\nEntropy: " << file.getEntropy() << endl;
    file.writeCodesOfMessage(HUFFMAN);
    file.writeCodesOfMessage(UNIFORM);
    file.writeCodesOfMessage(SHANNON);
    file.writeCodesOfSymbols(HUFFMAN);
    file.writeCodesOfSymbols(UNIFORM);
    file.writeCodesOfSymbols(SHANNON);
    cout << "Size Uniform Codes: " << file.byteSizeCode(UNIFORM)<< endl;
    cout << "Size Code Shannon:  " << file.byteSizeCode(SHANNON)<< endl;
    cout << "Size Code Huffman:  " << file.byteSizeCode(HUFFMAN)<< endl << endl;
	cout << "Compression ratio Shannon's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(SHANNON) << endl;
	cout << "Compression ratio Huffman's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(HUFFMAN) << endl;
    long double shannonSize, huffmanSize, uniformSize;
    uniformSize = file.sizeCode(UNIFORM);
    shannonSize = file.sizeCode(SHANNON);
    huffmanSize = file.sizeCode(HUFFMAN);
    cout << uniformSize << ' ' << shannonSize << ' ' << huffmanSize << '\n';
    cout << "Redundancy Shannon's code: " << (uniformSize-shannonSize)/shannonSize << endl;
    cout << "Redundancy Huffman's code: " << (uniformSize-huffmanSize)/huffmanSize << endl;
    out.close();
    //system("pause>>null");
    return 0;
}